

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O2

void Map_MappingExpandTruth(uint *uTruth,int nVars)

{
  byte bVar1;
  uint uVar2;
  
  if (nVars < 7) {
    if (nVars != 6) {
      uVar2 = *uTruth;
      if (nVars < 5) {
        bVar1 = (byte)(-1 << ((byte)nVars & 0x1f));
        uVar2 = (uVar2 << (bVar1 & 0x1f)) >> (bVar1 & 0x1f);
        for (; nVars != 5; nVars = nVars + 1) {
          uVar2 = uVar2 | uVar2 << ((byte)(1 << ((byte)nVars & 0x1f)) & 0x1f);
        }
        *uTruth = uVar2;
      }
      uTruth[1] = uVar2;
    }
    return;
  }
  __assert_fail("nVars < 7",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperUtils.c"
                ,0x2a0,"void Map_MappingExpandTruth(unsigned int *, int)");
}

Assistant:

void Map_MappingExpandTruth( unsigned uTruth[2], int nVars )
{
    assert( nVars < 7 );
    if ( nVars == 6 )
        return;
    if ( nVars < 5 )
    {
        uTruth[0] &= MAP_MASK( (1<<nVars) );
        uTruth[0]  = Map_MappingExpandTruth_rec( uTruth[0], nVars );
    }
    uTruth[1] = uTruth[0];
}